

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatcc_json_parser.h
# Opt level: O0

char * flatcc_json_parser_bool(flatcc_json_parser_t *ctx,char *buf,char *end,uint8_t *v)

{
  int iVar1;
  uint8_t local_39;
  char *pcStack_38;
  uint8_t tmp;
  char *k;
  uint8_t *v_local;
  char *end_local;
  char *buf_local;
  flatcc_json_parser_t *ctx_local;
  
  if (((long)end - (long)buf < 4) || (*(int *)buf != 0x65757274)) {
    pcStack_38 = buf;
    k = (char *)v;
    v_local = (uint8_t *)end;
    end_local = buf;
    buf_local = (char *)ctx;
    if ((4 < (long)end - (long)buf) && (iVar1 = memcmp(buf,"false",5), iVar1 == 0)) {
      *k = '\0';
      return pcStack_38 + 5;
    }
    ctx_local = (flatcc_json_parser_t *)
                flatcc_json_parser_uint8
                          ((flatcc_json_parser_t *)buf_local,end_local,(char *)v_local,&local_39);
    *k = local_39 != '\0';
  }
  else {
    *v = '\x01';
    ctx_local = (flatcc_json_parser_t *)(buf + 4);
  }
  return (char *)ctx_local;
}

Assistant:

static inline const char *flatcc_json_parser_bool(flatcc_json_parser_t *ctx, const char *buf, const char *end, uint8_t *v)
{
    const char *k;
    uint8_t tmp;

    k = buf;
    if (end - buf >= 4 && memcmp(buf, "true", 4) == 0) {
        *v = 1;
        return k + 4;
    } else if (end - buf >= 5 && memcmp(buf, "false", 5) == 0) {
        *v = 0;
        return k + 5;
    }
    buf = flatcc_json_parser_uint8(ctx, buf, end, &tmp);
    *v = !!tmp;
    return buf;
}